

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O1

Node * __thiscall AvlTree::containsElement(AvlTree *this,int value,Node *node)

{
  long lVar1;
  
  while( true ) {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    lVar1 = 8;
    if ((node->value <= value) && (lVar1 = 0x10, value <= node->value)) break;
    node = *(Node **)((long)&node->value + lVar1);
  }
  return node;
}

Assistant:

AvlTree::Node *AvlTree::containsElement(int value, Node *node) {
    if (node == nullptr) { // Element not found
        return nullptr;
    } else if (value < node->value) { // Searching for element
        return containsElement(value, node->leftChild);
    } else if (value > node->value) {
        return containsElement(value, node->rightChild);
    } else { // Element found
        return node;
    }
}